

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

unsigned_long ENTROPY_DEBUG(char *label,unsigned_long entropy)

{
  int *piVar1;
  ulong uVar2;
  char *afterValue;
  
  afterValue = getenv("EXPAT_ENTROPY_DEBUG");
  if (afterValue != (char *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0;
    uVar2 = strtoul(afterValue,&afterValue,10);
    if ((*piVar1 == 0) && (*afterValue == '\0')) {
      if (uVar2 != 0) {
        fprintf(_stderr,"expat: Entropy: %s --> 0x%0*lx (%lu bytes)\n",label,0x10,entropy,8);
      }
    }
    else {
      *piVar1 = 0;
    }
  }
  return entropy;
}

Assistant:

static unsigned long
ENTROPY_DEBUG(const char *label, unsigned long entropy) {
  if (getDebugLevel("EXPAT_ENTROPY_DEBUG", 0) >= 1u) {
    fprintf(stderr, "expat: Entropy: %s --> 0x%0*lx (%lu bytes)\n", label,
            (int)sizeof(entropy) * 2, entropy, (unsigned long)sizeof(entropy));
  }
  return entropy;
}